

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int write_file_contents(archive_write *a,int64_t offset,int64_t size)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  size_t size_00;
  int *piVar4;
  ulong __nbytes;
  
  pvVar1 = a->format_data;
  lseek(*(int *)((long)pvVar1 + 8),offset,0);
  while( true ) {
    if (size == 0) {
      return 0;
    }
    uVar2 = *(ulong *)((long)a->format_data + 0x102e0);
    __nbytes = uVar2;
    if ((ulong)size <= uVar2) {
      __nbytes = size;
    }
    size_00 = read(*(int *)((long)pvVar1 + 8),(void *)((long)a->format_data + (0x102dc - uVar2)),
                   __nbytes);
    if ((long)size_00 < 1) break;
    size = size - size_00;
    iVar3 = wb_consume(a,size_00);
    if (iVar3 < 0) {
      return iVar3;
    }
  }
  piVar4 = __errno_location();
  archive_set_error(&a->archive,*piVar4,"Can\'t read temporary file(%jd)",size_00);
  return -0x1e;
}

Assistant:

static int
write_file_contents(struct archive_write *a, int64_t offset, int64_t size)
{
	struct iso9660 *iso9660 = a->format_data;
	int r;

	lseek(iso9660->temp_fd, offset, SEEK_SET);

	while (size) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		wb = wb_buffptr(a);
		rsize = wb_remaining(a);
		if (rsize > (size_t)size)
			rsize = (size_t)size;
		rs = read(iso9660->temp_fd, wb, rsize);
		if (rs <= 0) {
			archive_set_error(&a->archive, errno,
			    "Can't read temporary file(%jd)", (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		size -= rs;
		r = wb_consume(a, rs);
		if (r < 0)
			return (r);
	}
	return (ARCHIVE_OK);
}